

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O0

vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
* __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::
export_filter<boost::asio::ip::address_v4>
          (vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
           *__return_storage_ptr__,filter_impl<std::array<unsigned_char,_4UL>_> *this)

{
  bool bVar1;
  size_type __n;
  pointer prVar2;
  bytes_type local_60;
  address_v4 local_5c;
  bytes_type local_58;
  address_v4 local_54;
  address_v4 local_50;
  undefined1 local_4c [8];
  ip_range<boost::asio::ip::address_v4> r;
  iterator end;
  iterator i;
  filter_impl<std::array<unsigned_char,_4UL>_> *this_local;
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  *ret;
  
  ::std::
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  ::vector(__return_storage_ptr__);
  __n = ::std::
        set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
        ::size(&this->m_access_list);
  ::std::
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  ::reserve(__return_storage_ptr__,__n);
  end = ::std::
        set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
        ::begin(&this->m_access_list);
  r._4_8_ = ::std::
            set<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>_>
            ::end(&this->m_access_list);
  while (bVar1 = ::std::operator!=(&end,(_Self *)&r.last), bVar1) {
    ip_range<boost::asio::ip::address_v4>::ip_range
              ((ip_range<boost::asio::ip::address_v4> *)local_4c);
    prVar2 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&end);
    boost::asio::ip::address_v4::address_v4(&local_50,&prVar2->start);
    boost::asio::ip::address_v4::operator=((address_v4 *)local_4c,&local_50);
    prVar2 = ::std::
             _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
             ::operator->(&end);
    r.first.addr_.s_addr = (in4_addr_type)prVar2->access;
    ::std::
    _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>::
    operator++(&end);
    bVar1 = ::std::operator==(&end,(_Self *)&r.last);
    if (bVar1) {
      local_58._M_elems = (_Type)max_addr<std::array<unsigned_char,4ul>>();
      boost::asio::ip::address_v4::address_v4(&local_54,&local_58);
      boost::asio::ip::address_v4::operator=((address_v4 *)(local_4c + 4),&local_54);
    }
    else {
      prVar2 = ::std::
               _Rb_tree_const_iterator<libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::range>
               ::operator->(&end);
      local_60._M_elems = (_Type)minus_one<std::array<unsigned_char,4ul>>(&prVar2->start);
      boost::asio::ip::address_v4::address_v4(&local_5c,&local_60);
      boost::asio::ip::address_v4::operator=((address_v4 *)(local_4c + 4),&local_5c);
    }
    ::std::
    vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_4c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ip_range<ExternalAddressType>> filter_impl<Addr>::export_filter() const
	{
		std::vector<ip_range<ExternalAddressType>> ret;
		ret.reserve(m_access_list.size());

		for (auto i = m_access_list.begin()
			, end(m_access_list.end()); i != end;)
		{
			ip_range<ExternalAddressType> r;
			r.first = ExternalAddressType(i->start);
			r.flags = i->access;

			++i;
			if (i == end)
				r.last = ExternalAddressType(max_addr<Addr>());
			else
				r.last = ExternalAddressType(minus_one(i->start));

			ret.push_back(r);
		}
		return ret;
	}